

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O2

int AF_A_DelayGib(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  char *__assertion;
  DObject *this_00;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005436f0;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_00543659:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005436f0;
        }
      }
      if (numparam == 1) goto LAB_005436c3;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005436e0;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005436f0;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005436e0;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005436c3:
        iVar3 = FRandom::operator()(&pr_delaygib);
        *(int *)&this_00[9].Class = *(int *)&this_00[9].Class - (iVar3 >> 2);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005436f0;
    }
    if (this_00 == (DObject *)0x0) goto LAB_00543659;
  }
LAB_005436e0:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005436f0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0x119,"int AF_A_DelayGib(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DelayGib)
{
	PARAM_ACTION_PROLOGUE;

	self->tics -= pr_delaygib()>>2;
	return 0;
}